

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nes_system.c
# Opt level: O1

void nes_system_reset(nes_system *system)

{
  nes_system_state *pnVar1;
  int iVar2;
  uint32_t i;
  long lVar3;
  
  lVar3 = 0;
  memset(&(system->state).ppu,0,0x1ac);
  (system->state).ppu.palettes[0] = '\t';
  (system->state).ppu.palettes[1] = '\x01';
  (system->state).ppu.palettes[2] = '\0';
  (system->state).ppu.palettes[3] = '\x01';
  (system->state).ppu.palettes[4] = '\0';
  (system->state).ppu.palettes[5] = '\x02';
  (system->state).ppu.palettes[6] = '\x02';
  (system->state).ppu.palettes[7] = '\r';
  pnVar1 = &system->state;
  (pnVar1->ppu).palettes[8] = '\b';
  (pnVar1->ppu).palettes[9] = '\x10';
  (pnVar1->ppu).palettes[10] = '\b';
  (pnVar1->ppu).palettes[0xb] = '$';
  (pnVar1->ppu).palettes[0xc] = '\0';
  (pnVar1->ppu).palettes[0xd] = '\0';
  (pnVar1->ppu).palettes[0xe] = '\x04';
  (pnVar1->ppu).palettes[0xf] = ',';
  pnVar1 = &system->state;
  (pnVar1->ppu).palettes[0x10] = '\t';
  (pnVar1->ppu).palettes[0x11] = '\x01';
  (pnVar1->ppu).palettes[0x12] = '4';
  (pnVar1->ppu).palettes[0x13] = '\x03';
  (pnVar1->ppu).palettes[0x14] = '\0';
  (pnVar1->ppu).palettes[0x15] = '\x04';
  (pnVar1->ppu).palettes[0x16] = '\0';
  (pnVar1->ppu).palettes[0x17] = '\x14';
  pnVar1 = &system->state;
  (pnVar1->ppu).palettes[0x18] = '\b';
  (pnVar1->ppu).palettes[0x19] = ':';
  (pnVar1->ppu).palettes[0x1a] = '\0';
  (pnVar1->ppu).palettes[0x1b] = '\x02';
  (pnVar1->ppu).palettes[0x1c] = '\0';
  (pnVar1->ppu).palettes[0x1d] = ' ';
  (pnVar1->ppu).palettes[0x1e] = ',';
  (pnVar1->ppu).palettes[0x1f] = '\b';
  (system->state).ppu.scanline = 0xf1;
  (system->state).ppu.color_out = '\x0f';
  memset(&(system->state).apu,0,0x1fac);
  (system->state).apu.noise.shift_register = 1;
  (system->state).apu.cycle = 1;
  (system->state).cpu.cycle = 0;
  (system->state).cpu.PC = 0;
  (system->state).cpu.S = '\0';
  (system->state).cpu.P = '$';
  (system->state).cpu.address = 0;
  (system->state).cpu.rw_mode = '\0';
  (system->state).cpu.field_0x9 = 1;
  (system->state).cpu.data = '\0';
  (system->state).cpu.temp = 0xfc;
  (system->state).cpu.A = '\0';
  (system->state).cpu.X = '\0';
  (system->state).cpu.Y = '\0';
  (system->state).cpu.field_0xf = 0;
  (system->state).cpu_odd_cycle = 1;
  (system->state).oam_dma = 0;
  (system->state).dmc_dma = 0;
  (system->state).oam_dma_data = '\0';
  (system->state).oam_dma_cycle = 0;
  (system->state).oam_dma_src_address = 0;
  (system->state).oam_dma_dst_address = '\0';
  (system->state).controller_input0 = '\0';
  (system->state).controller_input1 = '\x01';
  do {
    iVar2 = rand();
    (system->state).ram[lVar3] = (uint8_t)iVar2;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 0x800);
  return;
}

Assistant:

void nes_system_reset(nes_system* system)
{
    nes_system_state* state = &system->state;

    nes_ppu_reset(&state->ppu);
    nes_apu_reset(&state->apu);
    state->cpu = cpu_reset();
    state->cpu_odd_cycle = 1;
    state->dmc_dma = 0;
    state->oam_dma = 0;
    state->oam_dma_data = 0;
    state->oam_dma_cycle = 0;
    state->oam_dma_src_address = 0;
    state->oam_dma_dst_address = 0;
    state->controller_input0 = 0;
    state->controller_input1 = 1;

    for (uint32_t i = 0; i < 0x800; ++i)
        state->ram[i] = (uint8_t)rand();
}